

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O3

void remove_dev(lys_deviation *dev,lys_module *module)

{
  byte bVar1;
  lys_deviation *plVar2;
  char *__needle;
  lys_module *plVar3;
  lys_module *plVar4;
  char *pcVar5;
  size_t sVar6;
  LY_ERR *pLVar7;
  long lVar8;
  uint32_t local_34 [2];
  uint32_t idx;
  
  local_34[0] = 0;
  if (dev->orig_node == (lys_node *)0x0) {
    pLVar7 = ly_errno_location();
    *pLVar7 = LY_EINT;
    ly_log(LY_LLERR,"Internal error (%s:%d).",
           "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_schema.c"
           ,0x1080);
    return;
  }
  plVar3 = dev->orig_node->module;
  if ((plVar3->field_0x40 & 1) != 0) {
    plVar3 = (lys_module *)plVar3->data;
  }
  lys_switch_deviation(dev,module);
  plVar4 = ly_ctx_get_module_iter(module->ctx,local_34);
  do {
    if (plVar4 == (lys_module *)0x0) {
      plVar3->field_0x40 = plVar3->field_0x40 & 0xcf;
      return;
    }
    if (((plVar4 != module) && (plVar4 != plVar3)) &&
       (bVar1 = plVar4->deviation_size, (ulong)bVar1 != 0)) {
      plVar2 = plVar4->deviation;
      __needle = plVar3->name;
      lVar8 = 0;
      do {
        pcVar5 = strstr(*(char **)((long)&plVar2->target_name + lVar8),__needle);
        if ((pcVar5 != (char *)0x0) && (sVar6 = strlen(__needle), pcVar5[sVar6] == ':')) {
          return;
        }
        lVar8 = lVar8 + 0x38;
      } while ((ulong)bVar1 * 0x38 - lVar8 != 0);
    }
    plVar4 = ly_ctx_get_module_iter(module->ctx,local_34);
  } while( true );
}

Assistant:

static void
remove_dev(struct lys_deviation *dev, const struct lys_module *module)
{
    uint32_t idx = 0, j;
    const struct lys_module *mod;
    struct lys_module *target_mod;
    const char *ptr;

    if (dev->orig_node) {
        target_mod = lys_node_module(dev->orig_node);
    } else {
        LOGINT;
        return;
    }
    lys_switch_deviation(dev, module);

    /* clear the deviation flag if possible */
    while ((mod = ly_ctx_get_module_iter(module->ctx, &idx))) {
        if ((mod == module) || (mod == target_mod)) {
            continue;
        }

        for (j = 0; j < mod->deviation_size; ++j) {
            ptr = strstr(mod->deviation[j].target_name, target_mod->name);
            if (ptr && (ptr[strlen(target_mod->name)] == ':')) {
                /* some other module deviation targets the inspected module, flag remains */
                break;
            }
        }

        if (j < mod->deviation_size) {
            break;
        }
    }

    if (!mod) {
        target_mod->deviated = 0;
    }
}